

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  bool bVar6;
  string *psVar7;
  long lVar8;
  string bspName;
  string m_2;
  string platform;
  string osdir;
  string arch;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  if (p->_M_string_length == 0) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "Green Hills MULTI: -A <arch> not specified; defaulting to \"arm\"","");
    cmSystemTools::Message(&local_90,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)local_50._M_string_length,0x559b33);
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"CMAKE_GENERATOR_PLATFORM","");
    cmMakefile::AddCacheDefinition
              (mf,&local_90,local_50._M_dataplus._M_p,"Name of generator platform.",INTERNAL,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GHS_TARGET_PLATFORM","");
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_70);
  pcVar5 = (psVar7->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar5,pcVar5 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"GHS_OS_DIR","");
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_d0);
  pcVar5 = (psVar7->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar5,pcVar5 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  bVar6 = cmSystemTools::IsOff(local_70._M_dataplus._M_p);
  if (bVar6) {
    lVar8 = std::__cxx11::string::find((char *)&local_90,0x52b4ab,0);
    if (lVar8 != -1) {
      bVar6 = cmake::GetIsInTryCompile((this->super_cmGlobalGenerator).CMakeInstance);
      if (!bVar6) {
        local_d0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "Green Hills MULTI: GHS_OS_DIR not specified; No OS found in \"","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GHS_OS_ROOT","");
        psVar7 = cmMakefile::GetSafeDefinition(mf,&local_b0);
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(psVar7->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_d0);
        cmSystemTools::Message(&local_d0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar3) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_70,0,(char *)local_70._M_string_length,0x52b4ff);
      goto LAB_00253c79;
    }
  }
  bVar6 = cmake::GetIsInTryCompile((this->super_cmGlobalGenerator).CMakeInstance);
  if (!bVar6) {
    bVar6 = cmSystemTools::IsOff(&this->OsDir);
    if (bVar6) {
      bVar6 = cmSystemTools::IsOff(&local_70);
      if (!bVar6) {
        local_d0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Green Hills MULTI: GHS_OS_DIR not specified; found \"","");
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_d0);
        cmSystemTools::Message(&local_d0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar3) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
LAB_00253c79:
  std::__cxx11::string::_M_assign((string *)&this->OsDir);
  paVar4 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GHS_BSP_NAME","");
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_b0);
  pcVar5 = (psVar7->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar5,pcVar5 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar6 = cmSystemTools::IsOff(local_d0._M_dataplus._M_p);
  if (bVar6) {
    lVar8 = std::__cxx11::string::find((char *)&local_90,0x52b4ab,0);
    if (lVar8 != -1) {
      std::operator+(&local_b0,"sim",&local_50);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar4) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GHS_BSP_NAME","");
      cmMakefile::AddCacheDefinition
                (mf,&local_b0,local_d0._M_dataplus._M_p,"Name of GHS target platform.",STRING,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar4) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "Green Hills MULTI: GHS_BSP_NAME not specified; defaulting to \"","");
      std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_b0);
      cmSystemTools::Message(&local_b0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar4) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  std::string arch;
  if (p.empty()) {
    cmSystemTools::Message(
      "Green Hills MULTI: -A <arch> not specified; defaulting to \"arm\"");
    arch = "arm";

    /* store the platform name for later use
     * -- already done if -A<arch> was specified
     */
    mf->AddCacheDefinition("CMAKE_GENERATOR_PLATFORM", arch.c_str(),
                           "Name of generator platform.",
                           cmStateEnums::INTERNAL);
  } else {
    arch = p;
  }

  /* check if OS location has been updated by platform scripts */
  std::string platform = mf->GetSafeDefinition("GHS_TARGET_PLATFORM");
  std::string osdir = mf->GetSafeDefinition("GHS_OS_DIR");
  if (cmSystemTools::IsOff(osdir.c_str()) &&
      platform.find("integrity") != std::string::npos) {
    if (!this->CMakeInstance->GetIsInTryCompile()) {
      /* required OS location is not found */
      std::string m =
        "Green Hills MULTI: GHS_OS_DIR not specified; No OS found in \"";
      m += mf->GetSafeDefinition("GHS_OS_ROOT");
      m += "\"";
      cmSystemTools::Message(m);
    }
    osdir = "GHS_OS_DIR-NOT-SPECIFIED";
  } else if (!this->CMakeInstance->GetIsInTryCompile() &&
             cmSystemTools::IsOff(this->OsDir) &&
             !cmSystemTools::IsOff(osdir)) {
    /* OS location was updated by auto-selection */
    std::string m = "Green Hills MULTI: GHS_OS_DIR not specified; found \"";
    m += osdir;
    m += "\"";
    cmSystemTools::Message(m);
  }
  this->OsDir = osdir;

  // Determine GHS_BSP_NAME
  std::string bspName = mf->GetSafeDefinition("GHS_BSP_NAME");

  if (cmSystemTools::IsOff(bspName.c_str()) &&
      platform.find("integrity") != std::string::npos) {
    bspName = "sim" + arch;
    /* write back the calculate name for next time */
    mf->AddCacheDefinition("GHS_BSP_NAME", bspName.c_str(),
                           "Name of GHS target platform.",
                           cmStateEnums::STRING, true);
    std::string m =
      "Green Hills MULTI: GHS_BSP_NAME not specified; defaulting to \"";
    m += bspName;
    m += "\"";
    cmSystemTools::Message(m);
  }

  return true;
}